

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::get_transform_feedback_varying
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RenderContext *pRVar2;
  GLuint program_00;
  long lVar3;
  GLuint tfID;
  value_type local_300;
  GLsizei size;
  GLsizei length;
  int maxTransformFeedbackVaryings;
  char *tfVarying;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  GLenum type;
  char name [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_218;
  undefined1 local_1f8 [40];
  ShaderProgram programInvalid;
  ShaderProgram program;
  
  tfID = 0;
  pRVar2 = ctx->m_renderCtx;
  name._0_8_ = name + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)name,"#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             "");
  paVar1 = &local_300.field_2;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,"");
  programInvalid.m_program.m_info.linkOk = false;
  programInvalid.m_program.m_info._33_8_ = 0;
  programInvalid.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  programInvalid.m_program.m_info.infoLog.field_2._M_local_buf[8] = '\0';
  programInvalid.m_program.m_info.infoLog.field_2._9_7_ = 0;
  memset(&programInvalid,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&programInvalid,(value_type *)name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(programInvalid.m_shaders + 1),&local_300);
  glu::ShaderProgram::ShaderProgram(&program,pRVar2,(ProgramSources *)&programInvalid);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&programInvalid.m_program.m_info.infoLog.field_2);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &programInvalid.m_program);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&programInvalid.m_shaders[0].
                         super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((char *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,name._16_8_ + 1);
  }
  pRVar2 = ctx->m_renderCtx;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  tfVarying = (char *)&local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tfVarying);
  local_1f8[0x10] = 0;
  local_1f8._17_8_ = 0;
  local_1f8._0_8_ = (pointer)0x0;
  local_1f8[8] = 0;
  local_1f8._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)name,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)name,&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(name + 0x18),(value_type *)&tfVarying);
  glu::ShaderProgram::ShaderProgram(&programInvalid,pRVar2,(ProgramSources *)name);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1f8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_218);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(name + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tfVarying != &local_2c0) {
    operator_delete(tfVarying,local_2c0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  tfVarying = "gl_Position";
  maxTransformFeedbackVaryings = 0;
  program_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_00);
  glu::CallLogWrapper::glGenTransformFeedbacks(&ctx->super_CallLogWrapper,1,&tfID);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&ctx->super_CallLogWrapper,program.m_program.m_program,1,&tfVarying,0x8c8c);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBindTransformFeedback(&ctx->super_CallLogWrapper,0x8e22,tfID);
  NegativeTestContext::expectError(ctx,0);
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,
             "GL_INVALID_VALUE is generated if program is not the name of a program object.","");
  NegativeTestContext::beginSection(ctx,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetTransformFeedbackVarying
            (&ctx->super_CallLogWrapper,program_00,0,0x20,&length,&size,&type,(GLchar *)name);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,
             "GL_INVALID_VALUE is generated if index is greater or equal to the value of GL_TRANSFORM_FEEDBACK_VARYINGS."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0x8c83,
             &maxTransformFeedbackVaryings);
  glu::CallLogWrapper::glGetTransformFeedbackVarying
            (&ctx->super_CallLogWrapper,program.m_program.m_program,maxTransformFeedbackVaryings,
             0x20,&length,&size,&type,(GLchar *)name);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,
             "GL_INVALID_OPERATION or GL_INVALID_VALUE is generated program has not been linked.",""
            );
  NegativeTestContext::beginSection(ctx,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetTransformFeedbackVarying
            (&ctx->super_CallLogWrapper,programInvalid.m_program.m_program,0,0x20,&length,&size,
             &type,(GLchar *)name);
  NegativeTestContext::expectError(ctx,0x502,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTransformFeedbacks(&ctx->super_CallLogWrapper,1,&tfID);
  NegativeTestContext::expectError(ctx,0);
  glu::ShaderProgram::~ShaderProgram(&programInvalid);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void get_transform_feedback_varying (NegativeTestContext& ctx)
{
	GLuint					tfID = 0;
	glu::ShaderProgram		program			(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	glu::ShaderProgram		programInvalid	(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, ""));
	const char* tfVarying	= "gl_Position";
	int						maxTransformFeedbackVaryings = 0;

	GLsizei					length;
	GLsizei					size;
	GLenum					type;
	char					name[32];

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.glGenTransformFeedbacks				(1, &tfID);

	ctx.glTransformFeedbackVaryings			(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
	ctx.expectError						(GL_NO_ERROR);
	ctx.glLinkProgram						(program.getProgram());
	ctx.expectError						(GL_NO_ERROR);

	ctx.glBindTransformFeedback				(GL_TRANSFORM_FEEDBACK, tfID);
	ctx.expectError						(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not the name of a program object.");
	ctx.glGetTransformFeedbackVarying		(notAProgram, 0, 32, &length, &size, &type, &name[0]);
	ctx.expectError						(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater or equal to the value of GL_TRANSFORM_FEEDBACK_VARYINGS.");
	ctx.glGetProgramiv						(program.getProgram(), GL_TRANSFORM_FEEDBACK_VARYINGS, &maxTransformFeedbackVaryings);
	ctx.glGetTransformFeedbackVarying		(program.getProgram(), maxTransformFeedbackVaryings, 32, &length, &size, &type, &name[0]);
	ctx.expectError						(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION or GL_INVALID_VALUE is generated program has not been linked.");
	ctx.glGetTransformFeedbackVarying		(programInvalid.getProgram(), 0, 32, &length, &size, &type, &name[0]);
	ctx.expectError						(GL_INVALID_OPERATION, GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTransformFeedbacks			(1, &tfID);
	ctx.expectError						(GL_NO_ERROR);
}